

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

int Abc_NtkCountPis(Vec_Ptr_t *vSupp)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)vSupp->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)((*(uint *)((long)vSupp->pArray[lVar2] + 0x14) & 0xf) == 2);
      lVar2 = lVar2 + 1;
    } while (vSupp->nSize != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Abc_NtkCountPis( Vec_Ptr_t * vSupp )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
        Counter += Abc_ObjIsPi(pObj);
    return Counter;
}